

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_str<char>
          (BasicWriter<char> *this,StringValue<char> *s,FormatSpec *spec)

{
  FormatError *this_00;
  char *in_RDX;
  BasicWriter<char> *in_RSI;
  CStringRef in_RDI;
  size_t precision;
  char *in_stack_00000028;
  size_t str_size;
  char *str_value;
  BasicCStringRef<char> local_30;
  Buffer<char> *spec_00;
  
  internal::CharTraits<char>::convert('\0');
  if ((in_RDX[0x14] != '\0') && (in_RDX[0x14] != 's')) {
    internal::report_unknown_type(str_size._7_1_,in_stack_00000028);
  }
  spec_00 = in_RSI->buffer_;
  if ((spec_00 == (Buffer<char> *)0x0) && (in_RSI->_vptr_BasicWriter == (_func_int **)0x0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_30,"string pointer is null");
    FormatError::FormatError(this_00,in_RDI);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  if ((-1 < *(int *)(in_RDX + 0x10)) && ((Buffer<char> *)(long)*(int *)(in_RDX + 0x10) < spec_00)) {
    spec_00 = (Buffer<char> *)(long)*(int *)(in_RDX + 0x10);
  }
  write_str<char>(in_RSI,in_RDX,(size_t)in_RSI->_vptr_BasicWriter,(AlignSpec *)spec_00);
  return;
}

Assistant:

void BasicWriter<Char>::write_str(
    const internal::Arg::StringValue<StrChar> &s, const FormatSpec &spec) {
  // Check if StrChar is convertible to Char.
  internal::CharTraits<Char>::convert(StrChar());
  if (spec.type_ && spec.type_ != 's')
    internal::report_unknown_type(spec.type_, "string");
  const StrChar *str_value = s.value;
  std::size_t str_size = s.size;
  if (str_size == 0) {
    if (!str_value) {
      FMT_THROW(FormatError("string pointer is null"));
    }
  }
  std::size_t precision = static_cast<std::size_t>(spec.precision_);
  if (spec.precision_ >= 0 && precision < str_size)
    str_size = precision;
  write_str(str_value, str_size, spec);
}